

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_kslot(jit_State *J,TRef key,IRRef slot)

{
  ushort uVar1;
  uint uVar2;
  IRIns *pIVar3;
  uint local_40;
  IRRef ref;
  IRRef2 op12;
  IRIns *cir;
  IRIns *ir;
  IRRef slot_local;
  TRef key_local;
  jit_State *J_local;
  IRRef ref_1;
  
  pIVar3 = (J->cur).ir;
  uVar2 = key & 0xffff | slot << 0x10;
  uVar1 = J->chain[0x1e];
  while (local_40 = (uint)uVar1, local_40 != 0) {
    if (pIVar3[local_40].field_1.op12 == uVar2) goto LAB_0013f947;
    uVar1 = *(ushort *)((long)pIVar3 + (ulong)local_40 * 8 + 6);
  }
  local_40 = (J->cur).nk;
  if (local_40 <= J->irbotlim) {
    lj_ir_growbot(J);
  }
  local_40 = local_40 - 1;
  (J->cur).nk = local_40;
  pIVar3 = (J->cur).ir + local_40;
  (pIVar3->field_1).op12 = uVar2;
  (pIVar3->field_1).t.irt = '\x05';
  (pIVar3->field_1).o = '\x1e';
  (pIVar3->field_0).prev = J->chain[0x1e];
  J->chain[0x1e] = (IRRef1)local_40;
LAB_0013f947:
  return local_40 + 0x5000000;
}

Assistant:

TRef lj_ir_kslot(jit_State *J, TRef key, IRRef slot)
{
  IRIns *ir, *cir = J->cur.ir;
  IRRef2 op12 = IRREF2((IRRef1)key, (IRRef1)slot);
  IRRef ref;
  /* Const part is not touched by CSE/DCE, so 0-65535 is ok for IRMlit here. */
  lj_assertJ(tref_isk(key) && slot == (IRRef)(IRRef1)slot,
	     "out-of-range key/slot");
  for (ref = J->chain[IR_KSLOT]; ref; ref = cir[ref].prev)
    if (cir[ref].op12 == op12)
      goto found;
  ref = ir_nextk(J);
  ir = IR(ref);
  ir->op12 = op12;
  ir->t.irt = IRT_P32;
  ir->o = IR_KSLOT;
  ir->prev = J->chain[IR_KSLOT];
  J->chain[IR_KSLOT] = (IRRef1)ref;
found:
  return TREF(ref, IRT_P32);
}